

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PFData_test.cpp
# Opt level: O2

void __thiscall PFData_test_setData_Test::~PFData_test_setData_Test(PFData_test_setData_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(PFData_test, setData){
    PFData test = PFData();
    double data[24];
    for (int i =0; i<24; i++){
        data[i] = (double) rand() / 1000;
    }
    test.setR(1);
    test.setQ(1);
    test.setP(1);
    test.setDZ(1.0);
    test.setDY(1.0);
    test.setDX(1.0);
    test.setNZ(1);
    test.setNY(4);
    test.setNX(6);
    test.setData(data);
    test.writeFile("tests/test_write_file_out.pfb");
    PFData test_read = PFData("tests/test_write_file_out.pfb");
    test_read.loadHeader();
    test_read.loadData();
    EXPECT_EQ(1, test_read.getR());
    EXPECT_EQ(1, test_read.getQ());
    EXPECT_EQ(1, test_read.getP());
    EXPECT_EQ(1, test_read.getDZ());
    EXPECT_EQ(1, test_read.getDY());
    EXPECT_EQ(1, test_read.getDX());
    EXPECT_EQ(1, test_read.getNZ());
    EXPECT_EQ(4, test_read.getNY());
    EXPECT_EQ(6, test_read.getNX());
    EXPECT_EQ(0, test_read.getZ());
    EXPECT_EQ(0, test_read.getY());
    EXPECT_EQ(0, test_read.getX());

    test_read.close();
    test.close();
    ASSERT_EQ(0,remove("tests/test_write_file_out.pfb"));
}